

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O3

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,uint element)

{
  uint *puVar1;
  uint8_t *puVar2;
  
  if (this->minalign_ < 4) {
    this->minalign_ = 4;
  }
  vector_downward<unsigned_int>::fill(&this->buf_,(ulong)(-(this->buf_).size_ & 3));
  vector_downward<unsigned_int>::ensure_space(&this->buf_,4);
  puVar2 = (this->buf_).cur_;
  (this->buf_).cur_ = puVar2 + -4;
  puVar1 = &(this->buf_).size_;
  *puVar1 = *puVar1 + 4;
  *(uint *)(puVar2 + -4) = element;
  return (this->buf_).size_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }